

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::AssignmentExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  SyntaxKind kind;
  TimingControlSyntax *pTVar1;
  SyntaxNode *this;
  ConstantValue *pCVar2;
  ExpressionSyntax *pEVar3;
  Type *pTVar4;
  SourceRange sourceRange;
  undefined8 uVar5;
  bool bVar6;
  BinaryOperator BVar7;
  ulong uVar8;
  Expression *pEVar9;
  TimingControlExpressionSyntax *pTVar10;
  undefined4 extraout_var;
  Expression *lhs_00;
  SourceLocation SVar11;
  bitmask<slang::ast::ASTFlags> extraFlags;
  char *func;
  socklen_t __len;
  optional<slang::ast::BinaryOperator> op;
  optional<slang::ast::BinaryOperator> op_00;
  uint uVar12;
  DiagCode code;
  SyntaxNode *this_00;
  SourceRange SVar13;
  Expression *lhs;
  SourceLocation local_b8;
  ulong local_b0;
  SourceLocation local_88;
  SourceLocation SStack_80;
  SourceLocation local_78;
  SourceLocation SStack_70;
  sockaddr local_68;
  ulong local_58;
  Symbol *pSStack_50;
  TempVarSymbol *local_48;
  RandomizeDetails *pRStack_40;
  AssertionInstanceDetails *local_38;
  
  kind = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar12 = 0;
  if ((kind == NonblockingAssignmentExpression) &&
     (uVar12 = 1, ((context->flags).m_bits & 0x4000) != 0)) {
    SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0x9c;
LAB_0038f181:
    ASTContext::addDiag(context,code,SVar13);
    pEVar9 = Expression::badExpr(compilation,(Expression *)0x0);
    return pEVar9;
  }
  uVar8 = (context->flags).m_bits;
  if ((uVar8 & 0x20) == 0) {
    SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0xb;
    if ((uVar8 & 0xc0) == 0) {
      code.subsystem = Expressions;
      code.code = 0x16;
    }
    goto LAB_0038f181;
  }
  extraFlags.m_bits = 0x200;
  uVar8 = 0;
  if (kind == AssignmentExpression) {
    local_b0 = 0;
  }
  else {
    local_b0 = 0;
    if (kind != NonblockingAssignmentExpression) {
      BVar7 = Expression::getBinaryOperator(kind);
      uVar8 = (ulong)BVar7;
      local_b0 = 0x100000000;
      extraFlags.m_bits = 0;
    }
  }
  this_00 = &((syntax->right).ptr)->super_SyntaxNode;
  if (this_00 != (SyntaxNode *)0x0) {
    if ((((context->flags).m_bits & 0x400) == 0) || (this_00->kind != TimingControlExpression)) {
      local_b8 = (SourceLocation)0x0;
    }
    else {
      local_68._0_8_ = (context->scope).ptr;
      local_68.sa_data._6_8_ = *(undefined8 *)&context->lookupIndex;
      pSStack_50 = context->instanceOrProc;
      local_48 = context->firstTempVar;
      pRStack_40 = context->randomizeDetails;
      local_38 = context->assertionInstance;
      local_58 = (ulong)(kind == NonblockingAssignmentExpression) << 0xf | (context->flags).m_bits |
                 0x400000;
      pTVar10 = slang::syntax::SyntaxNode::as<slang::syntax::TimingControlExpressionSyntax>(this_00)
      ;
      pTVar1 = (pTVar10->timing).ptr;
      if (pTVar1 == (TimingControlSyntax *)0x0) {
        func = 
        "T slang::not_null<slang::syntax::TimingControlSyntax *>::get() const [T = slang::syntax::TimingControlSyntax *]"
        ;
        goto LAB_0038f4fb;
      }
      local_b8._0_4_ = TimingControl::bind((int)pTVar1,&local_68,__len);
      local_b8._4_4_ = extraout_var;
      this_00 = &((pTVar10->expr).ptr)->super_SyntaxNode;
      if (this_00 == (SyntaxNode *)0x0) goto LAB_0038f4cf;
    }
    this = &((syntax->left).ptr)->super_SyntaxNode;
    if (this != (SyntaxNode *)0x0) {
      if ((this->kind == AssignmentPatternExpression) &&
         (this_00->kind != StreamingConcatenationExpression)) {
        pEVar9 = (Expression *)
                 slang::syntax::SyntaxNode::as<slang::syntax::AssignmentPatternExpressionSyntax>
                           (this);
        pCVar2 = pEVar9->constant;
        if (pCVar2 != (ConstantValue *)0x0) {
LAB_0038f39a:
          if (pCVar2 == (ConstantValue *)0x0) {
            return pEVar9;
          }
          goto LAB_0038f3a8;
        }
        pEVar9 = Expression::selfDetermined
                           (compilation,(ExpressionSyntax *)this_00,context,
                            (bitmask<slang::ast::ASTFlags>)0x0);
        bVar6 = Expression::bad(pEVar9);
        if (bVar6) {
          pEVar9 = Expression::badExpr(compilation,pEVar9);
          goto LAB_0038f39a;
        }
        pEVar3 = (syntax->left).ptr;
        if (pEVar3 == (ExpressionSyntax *)0x0) goto LAB_0038f4cf;
        pTVar4 = (pEVar9->type).ptr;
        if (pTVar4 != (Type *)0x0) {
          local_68._0_8_ =
               Expression::create(compilation,pEVar3,context,(bitmask<slang::ast::ASTFlags>)0x400000
                                  ,pTVar4);
          Expression::selfDetermined(context,(Expression **)&local_68);
          uVar5 = local_68._0_8_;
          SVar11 = parsing::Token::location(&syntax->operatorToken);
          SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          local_78 = SVar13.startLoc;
          SStack_70 = SVar13.endLoc;
          op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::BinaryOperator>._4_4_ = 0;
          op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._M_value = uVar12;
          SVar13.endLoc = (SourceLocation)context;
          SVar13.startLoc = SStack_70;
          pEVar9 = fromComponents((AssignmentExpression *)compilation,
                                  (Compilation *)(local_b0 | uVar8),op,
                                  (bitmask<slang::ast::AssignFlags>)(underlying_type)uVar5,pEVar9,
                                  (Expression *)SVar11,local_b8,(TimingControl *)local_78,SVar13,
                                  (ASTContext *)compilation);
          goto LAB_0038f39a;
        }
      }
      else {
LAB_0038f3a8:
        pEVar3 = (syntax->left).ptr;
        if (pEVar3 == (ExpressionSyntax *)0x0) goto LAB_0038f4cf;
        pEVar9 = Expression::selfDetermined
                           (compilation,pEVar3,context,
                            (bitmask<slang::ast::ASTFlags>)(extraFlags.m_bits + 0x400000));
        pTVar4 = (pEVar9->type).ptr;
        if (pTVar4 != (Type *)0x0) {
          if (pTVar4->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar4);
          }
          if ((pTVar4->canonical->super_Symbol).kind == VirtualInterfaceType) {
            pTVar4 = (pEVar9->type).ptr;
            if (pTVar4 == (Type *)0x0) goto LAB_0038f4e6;
            lhs_00 = Expression::tryBindInterfaceRef(context,(ExpressionSyntax *)this_00,pTVar4);
          }
          else {
            lhs_00 = (Expression *)0x0;
          }
          if (lhs_00 != (Expression *)0x0) {
LAB_0038f463:
            SVar11 = parsing::Token::location(&syntax->operatorToken);
            SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            local_88 = SVar13.startLoc;
            SStack_80 = SVar13.endLoc;
            op_00.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::BinaryOperator>._4_4_ = 0;
            op_00.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._M_value = uVar12;
            sourceRange.endLoc = (SourceLocation)context;
            sourceRange.startLoc = SStack_80;
            pEVar9 = fromComponents((AssignmentExpression *)compilation,
                                    (Compilation *)(local_b0 | uVar8),op_00,
                                    (bitmask<slang::ast::AssignFlags>)(underlying_type)pEVar9,lhs_00
                                    ,(Expression *)SVar11,local_b8,(TimingControl *)local_88,
                                    sourceRange,(ASTContext *)compilation);
            return pEVar9;
          }
          if ((pEVar9->kind == Streaming) && (this_00->kind != StreamingConcatenationExpression)) {
            lhs_00 = Expression::selfDetermined
                               (compilation,(ExpressionSyntax *)this_00,context,extraFlags);
            goto LAB_0038f463;
          }
          pTVar4 = (pEVar9->type).ptr;
          if (pTVar4 != (Type *)0x0) {
            lhs_00 = Expression::create(compilation,(ExpressionSyntax *)this_00,context,extraFlags,
                                        pTVar4);
            goto LAB_0038f463;
          }
        }
      }
LAB_0038f4e6:
      func = 
      "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
      goto LAB_0038f4fb;
    }
  }
LAB_0038f4cf:
  func = 
  "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
  ;
LAB_0038f4fb:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& AssignmentExpression::fromSyntax(Compilation& compilation,
                                             const BinaryExpressionSyntax& syntax,
                                             const ASTContext& context) {
    bitmask<AssignFlags> assignFlags;
    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingAssignmentExpression;
    if (isNonBlocking)
        assignFlags = AssignFlags::NonBlocking;

    if (isNonBlocking && context.flags.has(ASTFlags::Final)) {
        context.addDiag(diag::NonblockingInFinal, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (!context.flags.has(ASTFlags::AssignmentAllowed)) {
        if (!context.flags.has(ASTFlags::NonProcedural) &&
            !context.flags.has(ASTFlags::AssignmentDisallowed)) {
            context.addDiag(diag::AssignmentRequiresParens, syntax.sourceRange());
        }
        else {
            context.addDiag(diag::AssignmentNotAllowed, syntax.sourceRange());
        }
        return badExpr(compilation, nullptr);
    }

    bitmask<ASTFlags> extraFlags = ASTFlags::None;
    std::optional<BinaryOperator> op;
    if (syntax.kind != SyntaxKind::AssignmentExpression &&
        syntax.kind != SyntaxKind::NonblockingAssignmentExpression) {
        op = getBinaryOperator(syntax.kind);
    }
    else {
        extraFlags |= ASTFlags::StreamingAllowed;
    }

    const ExpressionSyntax* rightExpr = syntax.right;

    // If we're in a top-level statement, check for an intra-assignment timing control.
    // Otherwise, we'll let this fall through to the default handler which will issue an error.
    const TimingControl* timingControl = nullptr;
    if (context.flags.has(ASTFlags::TopLevelStatement) &&
        rightExpr->kind == SyntaxKind::TimingControlExpression) {

        ASTContext timingCtx = context;
        timingCtx.flags |= ASTFlags::LValue;
        if (isNonBlocking)
            timingCtx.flags |= ASTFlags::NonBlockingTimingControl;

        auto& tce = rightExpr->as<TimingControlExpressionSyntax>();
        timingControl = &TimingControl::bind(*tce.timing, timingCtx);
        rightExpr = tce.expr;
    }

    // The right hand side of an assignment expression is typically an
    // "assignment-like context", except if the left hand side does not
    // have a self-determined type. That can only be true if the lhs is
    // an assignment pattern without an explicit type.
    // However, streaming concatenation has no explicit type either so it is excluded and such right
    // hand side will lead to diag::AssignmentPatternNoContext error later.
    if (syntax.left->kind == SyntaxKind::AssignmentPatternExpression &&
        rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
        auto& pattern = syntax.left->as<AssignmentPatternExpressionSyntax>();
        if (!pattern.type) {
            // In this case we have to bind the rhs first to determine the
            // correct type to use as the context for the lhs.
            Expression* rhs = &selfDetermined(compilation, *rightExpr, context);
            if (rhs->bad())
                return badExpr(compilation, rhs);

            auto lhs = &create(compilation, *syntax.left, context, ASTFlags::LValue, rhs->type);
            selfDetermined(context, lhs);

            return fromComponents(compilation, op, assignFlags, *lhs, *rhs,
                                  syntax.operatorToken.location(), timingControl,
                                  syntax.sourceRange(), context);
        }
    }

    auto& lhs = selfDetermined(compilation, *syntax.left, context, extraFlags | ASTFlags::LValue);

    Expression* rhs = nullptr;
    if (lhs.type->isVirtualInterface())
        rhs = tryBindInterfaceRef(context, *rightExpr, *lhs.type);

    if (!rhs) {
        // When LHS is a streaming concatenation which has no explicit type, RHS should be
        // self-determined and we cannot pass lsh.type to it. When both LHS and RHS are streaming
        // concatenations, pass lhs.type to notify RHS to exclude associative arrays for
        // isBitstreamType check, while RHS can still be self-determined by ignoring lhs type
        // information.
        if (lhs.kind == ExpressionKind::Streaming &&
            rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
            rhs = &selfDetermined(compilation, *rightExpr, context, extraFlags);
        }
        else {
            rhs = &create(compilation, *rightExpr, context, extraFlags, lhs.type);
        }
    }

    return fromComponents(compilation, op, assignFlags, lhs, *rhs, syntax.operatorToken.location(),
                          timingControl, syntax.sourceRange(), context);
}